

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O1

string * vkt::SpirVAssembly::makeVertexShaderAssembly
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *fragments)

{
  string local_60;
  StringTemplate local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,
             "OpCapability Shader\nOpCapability ClipDistance\nOpCapability CullDistance\nOpMemoryModel Logical GLSL450\nOpEntryPoint Vertex %main \"main\" %BP_stream %BP_position %BP_vtx_color %BP_color %BP_gl_VertexIndex %BP_gl_InstanceIndex\n${debug:opt}\nOpName %main \"main\"\nOpName %BP_gl_PerVertex \"gl_PerVertex\"\nOpMemberName %BP_gl_PerVertex 0 \"gl_Position\"\nOpMemberName %BP_gl_PerVertex 1 \"gl_PointSize\"\nOpMemberName %BP_gl_PerVertex 2 \"gl_ClipDistance\"\nOpMemberName %BP_gl_PerVertex 3 \"gl_CullDistance\"\nOpName %test_code \"testfun(vf4;\"\nOpName %BP_stream \"\"\nOpName %BP_position \"position\"\nOpName %BP_vtx_color \"vtxColor\"\nOpName %BP_color \"color\"\nOpName %BP_gl_VertexIndex \"gl_VertexIndex\"\nOpName %BP_gl_InstanceIndex \"gl_InstanceIndex\"\nOpMemberDecorate %BP_gl_PerVertex 0 BuiltIn Position\nOpMemberDecorate %BP_gl_PerVertex 1 BuiltIn PointSize\nOpMemberDecorate %BP_gl_PerVertex 2 BuiltIn ClipDistance\nOpMemberDecorate %BP_gl_PerVertex 3 BuiltIn CullDistance\nOpDecorate %BP_gl_PerVertex Block\nOpDecorate %BP_position Location 0\nOpDecorate %BP_vtx_color Location 1\nOpDecorate %BP_color Location 1\nOpDecorate %BP_gl_VertexIndex BuiltIn VertexIndex\nOpDecorate %BP_gl_InstanceIndex BuiltIn InstanceIndex\n${decoration:opt}\n%void = OpTypeVoid\n%bool = OpTypeBool\n%i32 = OpTypeInt 32 1\n%u32 = OpTypeInt 32 0\n%f32 = OpTypeFloat 32\n%v3f32 = OpTypeVector %f32 3\n%v4i32 = OpTypeVector %i32 4\n%v4f32 = OpTypeVector %f32 4\n%v4bool = OpTypeVector %bool 4\n%v4f32_function = OpTypeFunction %v4f32 %v4f32\n%fun = OpTypeFunction %void\n%ip_f32 = OpTypePointer Input %f32\n%ip_i32 = OpTypePointer Input %i32\n%ip_v3f32 = OpTypePointer Input %v3f32\n%ip_v4f32 = OpTypePointer Input %v4f32\n%op_f32 = OpTypePointer Output %f32\n%op_v4f32 = OpTypePointer Output %v4f32\n%fp_f32   = OpTypePointer Function %f32\n%fp_i32   = OpTypePointer Function %i32\n%fp_v4f32 = OpTypePointer Function %v4f32\n%c_f32_1 = OpConstant %f32 1.0\n%c_f32_0 = OpConstant %f32 0.0\n%c_f32_0_5 = OpConstant %f32 0.5\n%c_f32_n1  = OpConstant %f32 -1.\n%c_f32_7 = OpConstant %f32 7.0\n%c_f32_8 = OpConstant %f32 8.0\n%c_i32_0 = OpCo..." /* TRUNCATED STRING LITERAL */
             ,"");
  tcu::StringTemplate::StringTemplate(&local_40,&local_60);
  tcu::StringTemplate::specialize(__return_storage_ptr__,&local_40,fragments);
  tcu::StringTemplate::~StringTemplate(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string makeVertexShaderAssembly(const map<string, string>& fragments)
{
// \todo [2015-11-23 awoloszyn] Remove OpName once these have stabalized
	static const char vertexShaderBoilerplate[] =
		"OpCapability Shader\n"
		"OpCapability ClipDistance\n"
		"OpCapability CullDistance\n"
		"OpMemoryModel Logical GLSL450\n"
		"OpEntryPoint Vertex %main \"main\" %BP_stream %BP_position %BP_vtx_color %BP_color %BP_gl_VertexIndex %BP_gl_InstanceIndex\n"
		"${debug:opt}\n"
		"OpName %main \"main\"\n"
		"OpName %BP_gl_PerVertex \"gl_PerVertex\"\n"
		"OpMemberName %BP_gl_PerVertex 0 \"gl_Position\"\n"
		"OpMemberName %BP_gl_PerVertex 1 \"gl_PointSize\"\n"
		"OpMemberName %BP_gl_PerVertex 2 \"gl_ClipDistance\"\n"
		"OpMemberName %BP_gl_PerVertex 3 \"gl_CullDistance\"\n"
		"OpName %test_code \"testfun(vf4;\"\n"
		"OpName %BP_stream \"\"\n"
		"OpName %BP_position \"position\"\n"
		"OpName %BP_vtx_color \"vtxColor\"\n"
		"OpName %BP_color \"color\"\n"
		"OpName %BP_gl_VertexIndex \"gl_VertexIndex\"\n"
		"OpName %BP_gl_InstanceIndex \"gl_InstanceIndex\"\n"
		"OpMemberDecorate %BP_gl_PerVertex 0 BuiltIn Position\n"
		"OpMemberDecorate %BP_gl_PerVertex 1 BuiltIn PointSize\n"
		"OpMemberDecorate %BP_gl_PerVertex 2 BuiltIn ClipDistance\n"
		"OpMemberDecorate %BP_gl_PerVertex 3 BuiltIn CullDistance\n"
		"OpDecorate %BP_gl_PerVertex Block\n"
		"OpDecorate %BP_position Location 0\n"
		"OpDecorate %BP_vtx_color Location 1\n"
		"OpDecorate %BP_color Location 1\n"
		"OpDecorate %BP_gl_VertexIndex BuiltIn VertexIndex\n"
		"OpDecorate %BP_gl_InstanceIndex BuiltIn InstanceIndex\n"
		"${decoration:opt}\n"
		SPIRV_ASSEMBLY_TYPES
		SPIRV_ASSEMBLY_CONSTANTS
		SPIRV_ASSEMBLY_ARRAYS
		"%BP_gl_PerVertex = OpTypeStruct %v4f32 %f32 %a1f32 %a1f32\n"
		"%BP_op_gl_PerVertex = OpTypePointer Output %BP_gl_PerVertex\n"
		"%BP_stream = OpVariable %BP_op_gl_PerVertex Output\n"
		"%BP_position = OpVariable %ip_v4f32 Input\n"
		"%BP_vtx_color = OpVariable %op_v4f32 Output\n"
		"%BP_color = OpVariable %ip_v4f32 Input\n"
		"%BP_gl_VertexIndex = OpVariable %ip_i32 Input\n"
		"%BP_gl_InstanceIndex = OpVariable %ip_i32 Input\n"
		"${pre_main:opt}\n"
		"%main = OpFunction %void None %fun\n"
		"%BP_label = OpLabel\n"
		"%BP_pos = OpLoad %v4f32 %BP_position\n"
		"%BP_gl_pos = OpAccessChain %op_v4f32 %BP_stream %c_i32_0\n"
		"OpStore %BP_gl_pos %BP_pos\n"
		"%BP_col = OpLoad %v4f32 %BP_color\n"
		"%BP_col_transformed = OpFunctionCall %v4f32 %test_code %BP_col\n"
		"OpStore %BP_vtx_color %BP_col_transformed\n"
		"OpReturn\n"
		"OpFunctionEnd\n"
		"${testfun}\n";
	return tcu::StringTemplate(vertexShaderBoilerplate).specialize(fragments);
}